

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstHoisting.cpp
# Opt level: O3

Index __thiscall
wasm::ConstHoisting::getWrittenSize<wasm::LEB<long,signed_char>>
          (ConstHoisting *this,LEB<long,_signed_char> *thing)

{
  void *pvVar1;
  pointer puVar2;
  void *in_RDX;
  LEB<long,_signed_char> local_40;
  void *pvStack_38;
  BufferWithRandomAccess buffer;
  
  pvStack_38 = (void *)0x0;
  buffer.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  buffer.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_40 = (LEB<long,_signed_char>)thing->value;
  LEB<long,_signed_char>::write(&local_40,(int)&pvStack_38,in_RDX,local_40.value);
  puVar2 = buffer.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar1 = pvStack_38;
  if (pvStack_38 != (void *)0x0) {
    operator_delete(pvStack_38,
                    (long)buffer.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pvStack_38);
  }
  return (int)puVar2 - (int)pvVar1;
}

Assistant:

Index getWrittenSize(const T& thing) {
    BufferWithRandomAccess buffer;
    buffer << thing;
    return buffer.size();
  }